

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O2

NamespaceDeclaration * __thiscall
QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
          (QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this)

{
  qsizetype *pqVar1;
  NamespaceDeclaration *pNVar2;
  long lVar3;
  
  reserve(this,1);
  pNVar2 = this->data;
  lVar3 = this->tos + 1;
  this->tos = lVar3;
  pqVar1 = &pNVar2[lVar3].namespaceUri.m_pos;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pqVar1 = &pNVar2[lVar3].prefix.m_size;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pNVar2[lVar3].prefix.m_string = (QString *)0x0;
  pNVar2[lVar3].prefix.m_pos = 0;
  return pNVar2 + lVar3;
}

Assistant:

inline T &push() { reserve(1); return rawPush(); }